

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O3

void duckdb::ColumnDataCopy<duckdb::interval_t>
               (ColumnDataMetaData *meta_data,UnifiedVectorFormat *source_data,Vector *source,
               idx_t offset,idx_t copy_count)

{
  ColumnDataCollectionSegment *this;
  ColumnDataAppendState *state;
  sel_t *psVar1;
  unsigned_long *puVar2;
  byte bVar3;
  undefined8 uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  reference pvVar6;
  ulong uVar7;
  ColumnDataAllocator *this_01;
  data_ptr_t pdVar8;
  ulong uVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  long lVar11;
  idx_t iVar12;
  idx_t iVar13;
  VectorDataIndex prev_index;
  interval_t *result_data;
  long lVar14;
  ushort uVar15;
  idx_t local_b8;
  _Head_base<0UL,_unsigned_long_*,_false> local_78;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> local_70;
  unsigned_long local_60;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  long local_48;
  ulong local_40;
  unsigned_long local_38;
  
  if (copy_count != 0) {
    this = meta_data->segment;
    state = meta_data->state;
    prev_index.index = (meta_data->vector_data_index).index;
    local_b8 = offset;
    do {
      pvVar6 = vector<duckdb::VectorMetaData,_true>::operator[](&this->vector_data,prev_index.index)
      ;
      uVar9 = (ulong)(0x800 - pvVar6->count);
      uVar7 = copy_count;
      if (uVar9 < copy_count) {
        uVar7 = uVar9;
      }
      this_01 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&this->allocator);
      pdVar8 = ColumnDataAllocator::GetDataPointer
                         (this_01,&state->current_chunk_state,pvVar6->block_id,pvVar6->offset);
      local_78._M_head_impl = (unsigned_long *)(pdVar8 + 0x8000);
      local_70.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_70.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_60 = 0x800;
      if (pvVar6->count == 0) {
        switchD_00569a20::default(local_78._M_head_impl,0xff,0x100);
      }
      local_40 = copy_count;
      if ((source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (uVar9 != 0) {
          lVar11 = uVar7 + (uVar7 == 0);
          iVar12 = local_b8;
          do {
            psVar1 = source_data->sel->sel_vector;
            iVar13 = iVar12;
            if (psVar1 != (sel_t *)0x0) {
              iVar13 = (idx_t)psVar1[iVar12];
            }
            uVar15 = pvVar6->count;
            uVar4 = *(undefined8 *)(source_data->data + iVar13 * 0x10 + 8);
            *(undefined8 *)(pdVar8 + (ulong)uVar15 * 0x10) =
                 *(undefined8 *)(source_data->data + iVar13 * 0x10);
            *(undefined8 *)(pdVar8 + (ulong)uVar15 * 0x10 + 8) = uVar4;
            pdVar8 = pdVar8 + 0x10;
            iVar12 = iVar12 + 1;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
      }
      else if (uVar9 != 0) {
        lVar11 = local_b8 * 4;
        lVar14 = 0;
        local_48 = lVar11;
        do {
          psVar1 = source_data->sel->sel_vector;
          if (psVar1 == (sel_t *)0x0) {
            uVar9 = local_b8 + lVar14;
          }
          else {
            uVar9 = (ulong)*(uint *)((long)psVar1 + lVar14 * 4 + lVar11);
          }
          puVar2 = (source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar2 == (unsigned_long *)0x0) {
            uVar15 = pvVar6->count;
LAB_002b791f:
            uVar4 = *(undefined8 *)(source_data->data + uVar9 * 0x10 + 8);
            *(undefined8 *)(pdVar8 + (ulong)uVar15 * 0x10) =
                 *(undefined8 *)(source_data->data + uVar9 * 0x10);
            *(undefined8 *)(pdVar8 + (ulong)uVar15 * 0x10 + 8) = uVar4;
          }
          else {
            uVar15 = pvVar6->count;
            if ((puVar2[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0) goto LAB_002b791f;
            if (local_78._M_head_impl == (unsigned_long *)0x0) {
              local_38 = local_60;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_58,&local_38);
              p_Var5 = p_Stack_50;
              local_70.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = local_58;
              this_00._M_pi =
                   local_70.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
              local_58 = (element_type *)0x0;
              p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_70.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var5;
              if ((this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi),
                 p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
              }
              pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&local_70);
              local_78._M_head_impl =
                   (pTVar10->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              lVar11 = local_48;
            }
            bVar3 = (byte)((ulong)uVar15 + lVar14) & 0x3f;
            local_78._M_head_impl[(ulong)uVar15 + lVar14 >> 6] =
                 local_78._M_head_impl[(ulong)uVar15 + lVar14 >> 6] &
                 (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
          }
          lVar14 = lVar14 + 1;
          pdVar8 = pdVar8 + 0x10;
        } while (uVar7 + (uVar7 == 0) != lVar14);
      }
      pvVar6->count = pvVar6->count + (short)uVar7;
      copy_count = local_40 - uVar7;
      if (copy_count != 0) {
        if ((pvVar6->next_data).index == 0xffffffffffffffff) {
          ColumnDataCollectionSegment::AllocateVector
                    (this,&source->type,meta_data->chunk_data,&state->current_chunk_state,prev_index
                    );
        }
        pvVar6 = vector<duckdb::VectorMetaData,_true>::operator[]
                           (&this->vector_data,prev_index.index);
        prev_index.index = (pvVar6->next_data).index;
      }
      if (local_70.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_70.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      local_b8 = local_b8 + uVar7;
    } while (copy_count != 0);
  }
  return;
}

Assistant:

static void ColumnDataCopy(ColumnDataMetaData &meta_data, const UnifiedVectorFormat &source_data, Vector &source,
                           idx_t offset, idx_t copy_count) {
	TemplatedColumnDataCopy<StandardValueCopy<T>>(meta_data, source_data, source, offset, copy_count);
}